

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O3

void Fx_ManCubeDoubleCubeDivisors
               (Fx_Man_t *p,int iFirst,Vec_Int_t *vPivot,int fRemove,int fUpdate,int *fWarning)

{
  size_t __size;
  int iVar1;
  Vec_Int_t *pVVar2;
  Vec_Que_t *p_00;
  int iVar3;
  int iVar4;
  uint v;
  Vec_Wec_t *pVVar5;
  float *pfVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  Vec_Flt_t *pVVar12;
  
  pVVar5 = p->vCubes;
  if (iFirst < pVVar5->nSize) {
    uVar9 = (ulong)(uint)iFirst;
    do {
      if (iFirst < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar2 = pVVar5->pArray + uVar9;
      iVar3 = pVVar5->pArray[uVar9].nSize;
      if ((pVVar2 != vPivot && iVar3 != 0) &&
         ((((pVVar2->nCap & 0x40000000) == 0 || (pVVar2 <= vPivot)) ||
          ((vPivot->nCap & 0x40000000U) == 0)))) {
        if ((iVar3 < 1) || (vPivot->nSize < 1)) {
LAB_00267fe8:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*pVVar2->pArray != *vPivot->pArray) {
          return;
        }
        iVar3 = Fx_ManDivFindCubeFree(pVVar2,vPivot,p->vCubeFree,vPivot->pArray);
        if (p->vCubeFree->nSize == 4) {
          iVar4 = Fx_ManDivNormalize((Vec_Int_t *)&DAT_00000004);
          piVar8 = p->nDivMux;
          if ((iVar4 == 0) || (piVar8 = p->nDivMux + 1, iVar4 == 1)) {
            *piVar8 = *piVar8 + 1;
          }
          else {
            p->nDivMux[2] = p->nDivMux[2] + 1;
            if (p->fCanonDivs != 0) goto LAB_00267cf4;
          }
        }
        pVVar2 = p->vCubeFree;
        if (((p->LitCountMax == 0) || (pVVar2->nSize <= p->LitCountMax)) &&
           ((p->fCanonDivs == 0 || (pVVar2->nSize != 3)))) {
          v = Hsh_VecManAdd(p->pHash,pVVar2);
          pVVar12 = p->vWeights;
          uVar11 = pVVar12->nSize;
          if (fRemove == 0) {
            if (v == uVar11) {
              iVar4 = p->vCubeFree->nSize;
              if ((long)iVar4 < 1) {
                iVar7 = 0;
              }
              else {
                lVar10 = 0;
                iVar7 = 0;
                do {
                  uVar11 = p->vCubeFree->pArray[lVar10];
                  if ((int)uVar11 < 0) {
                    __assert_fail("Lit >= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                  ,0xf2,"int Abc_Lit2Var(int)");
                  }
                  uVar11 = uVar11 >> 2;
                  if (p->vLevels->nSize <= (int)uVar11) goto LAB_00267fe8;
                  iVar1 = p->vLevels->pArray[uVar11];
                  if (iVar7 <= iVar1) {
                    iVar7 = iVar1;
                  }
                  lVar10 = lVar10 + 1;
                } while (iVar4 != lVar10);
              }
              if (799 < iVar7) {
                iVar7 = 800;
              }
              if (v == pVVar12->nCap) {
                if ((int)v < 0x10) {
                  if (pVVar12->pArray == (float *)0x0) {
                    pfVar6 = (float *)malloc(0x40);
                  }
                  else {
                    pfVar6 = (float *)realloc(pVVar12->pArray,0x40);
                  }
                  pVVar12->pArray = pfVar6;
                  pVVar12->nCap = 0x10;
                }
                else {
                  __size = (ulong)(v * 2) * 4;
                  if (pVVar12->pArray == (float *)0x0) {
                    pfVar6 = (float *)malloc(__size);
                  }
                  else {
                    pfVar6 = (float *)realloc(pVVar12->pArray,__size);
                  }
                  pVVar12->pArray = pfVar6;
                  pVVar12->nCap = v * 2;
                }
              }
              else {
                pfVar6 = pVVar12->pArray;
              }
              iVar1 = pVVar12->nSize;
              pVVar12->nSize = iVar1 + 1;
              pfVar6[iVar1] = (float)iVar7 * -0.0009 + (float)-iVar4 + 0.9;
              pVVar12 = p->vWeights;
              uVar11 = pVVar12->nSize;
            }
            if ((int)uVar11 <= (int)v) {
              __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                            ,0x359,
                            "void Fx_ManCubeDoubleCubeDivisors(Fx_Man_t *, int, Vec_Int_t *, int, int, int *)"
                           );
            }
            if ((int)v < 0) goto LAB_00268045;
            iVar4 = iVar3 + p->vCubeFree->nSize + -1;
            iVar3 = 1;
          }
          else {
            if ((int)uVar11 <= (int)v) {
              __assert_fail("iDiv < Vec_FltSize(p->vWeights)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcFx.c"
                            ,0x35f,
                            "void Fx_ManCubeDoubleCubeDivisors(Fx_Man_t *, int, Vec_Int_t *, int, int, int *)"
                           );
            }
            if ((int)v < 0) {
LAB_00268045:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecFlt.h"
                            ,0x195,"void Vec_FltAddToEntry(Vec_Flt_t *, int, float)");
            }
            iVar4 = 1 - (iVar3 + p->vCubeFree->nSize);
            iVar3 = -1;
          }
          pVVar12->pArray[v] = (float)iVar4 + pVVar12->pArray[v];
          p->nPairsD = p->nPairsD + iVar3;
          if (fUpdate != 0) {
            p_00 = p->vPrio;
            if (((int)v < p_00->nCap) && (-1 < p_00->pOrder[v])) {
              Vec_QueUpdate(p_00,v);
            }
            else if (fRemove == 0) {
              Vec_QuePush(p_00,v);
            }
          }
        }
      }
LAB_00267cf4:
      uVar9 = uVar9 + 1;
      pVVar5 = p->vCubes;
    } while ((int)uVar9 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Fx_ManCubeDoubleCubeDivisors( Fx_Man_t * p, int iFirst, Vec_Int_t * vPivot, int fRemove, int fUpdate, int * fWarning )
{
    Vec_Int_t * vCube;
    int i, iDiv, Base;
    Vec_WecForEachLevelStart( p->vCubes, vCube, i, iFirst )
    {
        if ( Vec_IntSize(vCube) == 0 || vCube == vPivot )
            continue;
        if ( Vec_WecIntHasMark(vCube) && Vec_WecIntHasMark(vPivot) && vCube > vPivot )
            continue;
        if ( Vec_IntEntry(vCube, 0) != Vec_IntEntry(vPivot, 0) )
            break;
        Base = Fx_ManDivFindCubeFree( vCube, vPivot, p->vCubeFree, fWarning );
        if ( Vec_IntSize(p->vCubeFree) == 4 )
        { 
            int Value = Fx_ManDivNormalize( p->vCubeFree );
            if ( Value == 0 )
                p->nDivMux[0]++;
            else if ( Value == 1 )
                p->nDivMux[1]++;
            else
                p->nDivMux[2]++;
            if ( p->fCanonDivs && Value < 0 )
                continue;
        }
        if ( p->LitCountMax && p->LitCountMax < Vec_IntSize(p->vCubeFree) )
            continue;
        if ( p->fCanonDivs && Vec_IntSize(p->vCubeFree) == 3 )
            continue;
        iDiv = Hsh_VecManAdd( p->pHash, p->vCubeFree );
        if ( !fRemove )
        {
            if ( iDiv == Vec_FltSize(p->vWeights) )
                Vec_FltPush(p->vWeights, -Vec_IntSize(p->vCubeFree) + 0.9 - 0.0009 * Fx_ManComputeLevelDiv(p, p->vCubeFree));
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, Base + Vec_IntSize(p->vCubeFree) - 1 );
            p->nPairsD++;
        }
        else
        {
            assert( iDiv < Vec_FltSize(p->vWeights) );
            Vec_FltAddToEntry( p->vWeights, iDiv, -(Base + Vec_IntSize(p->vCubeFree) - 1) );
            p->nPairsD--;
        }
        if ( fUpdate )
        {
            if ( Vec_QueIsMember(p->vPrio, iDiv) )
                Vec_QueUpdate( p->vPrio, iDiv );
            else if ( !fRemove )
                Vec_QuePush( p->vPrio, iDiv );
        }
    } 
}